

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O3

bool anon_unknown.dwarf_a9a5e::testVectorFilter(void)

{
  bool bVar1;
  int iVar2;
  Value *this;
  ostream *poVar3;
  long lVar4;
  long *plVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  Value v;
  allocator_type local_b9;
  ValueHolder local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  Value local_48;
  
  Json::Value::Value(&local_48,arrayValue);
  Json::Value::Value((Value *)local_b8,"Hello");
  Json::Value::append(&local_48,(Value *)local_b8);
  Json::Value::~Value((Value *)local_b8);
  Json::Value::Value((Value *)local_b8,"world!");
  Json::Value::append(&local_48,(Value *)local_b8);
  Json::Value::~Value((Value *)local_b8);
  Json::Value::Value((Value *)local_b8,"ignore");
  Json::Value::append(&local_48,(Value *)local_b8);
  Json::Value::~Value((Value *)local_b8);
  local_b8[0].string_ = (char *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"default","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,__l,(allocator_type *)&local_60);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0].string_,local_a8[0] + 1);
  }
  local_b8[0].string_ = (char *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Hello","");
  plVar5 = local_88;
  local_98[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"world!","");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,__l_00,&local_b9);
  lVar4 = -0x40;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  local_b8[0].string_ = (char *)&local_48;
  if ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._16_8_ == 0) goto LAB_00178c2e;
  iVar2 = (*(code *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._24_8_)
                    ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,&local_78,local_b8);
  if (iVar2 == 0) {
    if ((long)local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_60.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      bVar1 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                        (local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         local_60.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      if (bVar1) {
        Json::Value::Value((Value *)local_b8,2);
        this = Json::Value::operator[](&local_48,1);
        Json::Value::operator=(this,(Value *)local_b8);
        Json::Value::~Value((Value *)local_b8);
        local_b8[0].string_ = (char *)local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"default","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_assign_aux<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                   local_b8,local_98);
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0].string_,local_a8[0] + 1);
        }
        local_b8[0].string_ = (char *)&local_48;
        if ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._16_8_ == 0) {
LAB_00178c2e:
          std::__throw_bad_function_call();
        }
        iVar2 = (*(code *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._24_8_)
                          ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,&local_78,
                           local_b8);
        if (iVar2 == 3) {
          Json::Value::Value((Value *)local_b8,"Hello");
          Json::Value::operator=(&local_48,(Value *)local_b8);
          Json::Value::~Value((Value *)local_b8);
          local_b8[0].string_ = (char *)local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"default","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_assign_aux<std::__cxx11::string_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_78,
                     local_b8,local_98);
          if (local_b8[0] != local_a8) {
            operator_delete(local_b8[0].string_,local_a8[0] + 1);
          }
          local_b8[0].string_ = (char *)&local_48;
          if ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._16_8_ == 0)
          goto LAB_00178c2e;
          iVar2 = (*(code *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._24_8_)
                            ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,&local_78,
                             local_b8);
          if (iVar2 == 6) {
            local_b8[0].string_ = (char *)local_a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"default","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_78,local_b8,local_98);
            if (local_b8[0] != local_a8) {
              operator_delete(local_b8[0].string_,local_a8[0] + 1);
            }
            local_b8[0].int_ = 0;
            if ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._16_8_ == 0)
            goto LAB_00178c2e;
            iVar2 = (*(code *)(anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_._24_8_)
                              ((anonymous_namespace)::StringVectorFilterHelper_abi_cxx11_,&local_78,
                               local_b8);
            if (iVar2 == 0) {
              if (local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_78.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                bVar1 = true;
                goto LAB_00178b86;
              }
              iVar2 = 0x16c;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ASSERT_TRUE(l.empty()) failed on line ",0x26);
            }
            else {
              iVar2 = 0x16b;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(StringVectorFilterHelper(l, nullptr) == ErrorCode::Success) failed on line "
                         ,0x57);
            }
          }
          else {
            iVar2 = 0x168;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::InvalidArray) failed on line "
                       ,0x57);
          }
        }
        else {
          iVar2 = 0x164;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::InvalidString) failed on line "
                     ,0x58);
        }
        goto LAB_00178b62;
      }
    }
    iVar2 = 0x160;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(l == expected) failed on line ",0x2a);
  }
  else {
    iVar2 = 0x15f;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::Success) failed on line ",
               0x52);
  }
LAB_00178b62:
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  bVar1 = false;
LAB_00178b86:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  Json::Value::~Value(&local_48);
  return bVar1;
}

Assistant:

bool testVectorFilter()
{
  Json::Value v(Json::arrayValue);
  v.append("Hello");
  v.append("world!");
  v.append("ignore");

  std::vector<std::string> l{ "default" };
  std::vector<std::string> expected{
    "Hello",
    "world!",
  };
  ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::Success);
  ASSERT_TRUE(l == expected);

  v[1] = 2;
  l = { "default" };
  ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::InvalidString);

  v = "Hello";
  l = { "default" };
  ASSERT_TRUE(StringVectorFilterHelper(l, &v) == ErrorCode::InvalidArray);

  l = { "default" };
  ASSERT_TRUE(StringVectorFilterHelper(l, nullptr) == ErrorCode::Success);
  ASSERT_TRUE(l.empty());

  return true;
}